

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmaturePopulate.cpp
# Opt level: O2

aiNode * Assimp::ArmaturePopulate::GetNodeFromStack
                   (aiString *node_name,vector<aiNode_*,_std::allocator<aiNode_*>_> *nodes)

{
  aiNode *this;
  bool bVar1;
  Logger *pLVar2;
  const_iterator __position;
  char *local_1c0 [4];
  ostream local_1a0 [376];
  
  __position._M_current =
       (nodes->super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>)._M_impl.
       super__Vector_impl_data._M_start;
  while( true ) {
    if ((nodes->super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>)._M_impl.
        super__Vector_impl_data._M_finish <= __position._M_current) {
      pLVar2 = DefaultLogger::get();
      Logger::error(pLVar2,"[Serious] GetNodeFromStack() can\'t find node from stack!");
      return (aiNode *)0x0;
    }
    this = *__position._M_current;
    if (this == (aiNode *)0x0) break;
    bVar1 = aiString::operator==(&this->mName,node_name);
    if (bVar1) {
      pLVar2 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[26]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
                 (char (*) [26])"Removed node from stack: ");
      std::operator<<(local_1a0,(this->mName).data);
      std::__cxx11::stringbuf::str();
      Logger::info(pLVar2,local_1c0[0]);
      std::__cxx11::string::~string((string *)local_1c0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
      std::vector<aiNode_*,_std::allocator<aiNode_*>_>::erase(nodes,__position);
      return this;
    }
    __position._M_current = __position._M_current + 1;
  }
  __assert_fail("element",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/ArmaturePopulate.cpp"
                ,0xf3,
                "static aiNode *Assimp::ArmaturePopulate::GetNodeFromStack(const aiString &, std::vector<aiNode *> &)"
               );
}

Assistant:

aiNode *ArmaturePopulate::GetNodeFromStack(const aiString &node_name,
                                           std::vector<aiNode *> &nodes) {
  std::vector<aiNode *>::iterator iter;
  aiNode *found = nullptr;
  for (iter = nodes.begin(); iter < nodes.end(); ++iter) {
    aiNode *element = *iter;
    ai_assert(element);
    // node valid and node name matches
    if (element->mName == node_name) {
      found = element;
      break;
    }
  }

  if (found != nullptr) {
    ASSIMP_LOG_INFO_F("Removed node from stack: ", found->mName.C_Str());
    // now pop the element from the node list
    nodes.erase(iter);

    return found;
  }

  // unique names can cause this problem
  ASSIMP_LOG_ERROR("[Serious] GetNodeFromStack() can't find node from stack!");

  return nullptr;
}